

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:320:23)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:320:23)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOr<kj::_::Void> local_350;
  NullableValue<kj::Exception> local_1b0;
  char local_18;
  
  local_1b0.isSet = false;
  local_18 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1b0);
  if (local_1b0.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_350,&local_1b0.field_1.value);
    local_350.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_350);
  }
  else {
    if (local_18 != '\x01') goto LAB_0017c7aa;
    anon_class_8_1_70ebebfb_for_func::operator()(&this->func);
    local_350.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_350.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_350);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_350);
LAB_0017c7aa:
  NullableValue<kj::Exception>::~NullableValue(&local_1b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }